

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::StrCat_abi_cxx11_(AlphaNum *a,AlphaNum *b)

{
  AlphaNum *x1;
  AlphaNum *in_RDX;
  AlphaNum *in_RSI;
  string *in_RDI;
  char *out;
  char *begin;
  string *result;
  AlphaNum *in_stack_ffffffffffffff50;
  string *out_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  reference local_38;
  undefined1 local_19;
  AlphaNum *local_18;
  AlphaNum *local_10;
  
  local_19 = 0;
  out_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  strings::AlphaNum::size(local_10);
  x1 = (AlphaNum *)strings::AlphaNum::size(local_18);
  std::__cxx11::string::resize((ulong)out_00);
  local_40._M_current = (char *)std::__cxx11::string::begin();
  local_38 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_40);
  Append2((char *)out_00,x1,in_stack_ffffffffffffff50);
  return in_RDI;
}

Assistant:

std::string StrCat(const AlphaNum &a, const AlphaNum &b) {
  std::string result;
  result.resize(a.size() + b.size());
  char *const begin = &*result.begin();
  char *out = Append2(begin, a, b);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}